

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inflate.c
# Opt level: O0

void inf_chksum(zng_stream *strm,uint8_t *src,uint32_t len)

{
  long lVar1;
  uint32_t uVar2;
  size_t in_RDX;
  uint8_t *in_RSI;
  long in_RDI;
  inflate_state *state;
  
  lVar1 = *(long *)(in_RDI + 0x38);
  if (*(int *)(lVar1 + 0x18) == 0) {
    uVar2 = (*functable.adler32)((uint32_t)*(undefined8 *)(lVar1 + 0x20),in_RSI,in_RDX);
    *(ulong *)(lVar1 + 0x20) = (ulong)uVar2;
    *(uint32_t *)(in_RDI + 0x5c) = uVar2;
  }
  else {
    (*functable.crc32_fold)((crc32_fold_s *)(lVar1 + 0xb0),in_RSI,in_RDX,0);
  }
  return;
}

Assistant:

static inline void inf_chksum(PREFIX3(stream) *strm, const uint8_t *src, uint32_t len) {
    struct inflate_state *state = (struct inflate_state*)strm->state;
#ifdef GUNZIP
    if (state->flags) {
        FUNCTABLE_CALL(crc32_fold)(&state->crc_fold, src, len, 0);
    } else
#endif
    {
        strm->adler = state->check = FUNCTABLE_CALL(adler32)(state->check, src, len);
    }
}